

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O3

int P_Set3DFloor(line_t *line,int param,int param2,int alpha)

{
  FTextureID *pFVar1;
  TArray<sector_t_*,_sector_t_*> *this;
  double dVar2;
  int iVar3;
  sector_t *psVar4;
  line_t *plVar5;
  extsector_t *peVar6;
  side_t *psVar7;
  undefined7 uVar8;
  uint uVar9;
  FDynamicColormap *pFVar10;
  ulong uVar11;
  F3DFloor *pFVar12;
  planeref *ppVar13;
  secplane_t *psVar14;
  ulong uVar15;
  FTextureID *pFVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  sector_t *psVar22;
  int iVar23;
  sector_t *psVar24;
  bool bVar25;
  FSectorTagIterator itr;
  FSectorTagIterator local_80;
  secplane_t *local_78;
  FTextureID *pFStack_70;
  sector_t *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ulong local_50;
  secplane_t *local_48;
  FTextureID *local_40;
  secplane_t *local_38;
  
  local_80.searchtag = line->args[0];
  psVar4 = line->frontsector;
  if (local_80.searchtag == 0) {
    local_80.start = 0;
  }
  else {
    local_80.start = tagManager.TagHashFirst[(byte)local_80.searchtag];
  }
  uVar9 = FSectorTagIterator::Next(&local_80);
  if ((int)uVar9 < 0) {
LAB_004fe884:
    psVar7 = line->sidedef[0];
    if (psVar7->textures[0].texture.texnum < 1) {
      psVar7->textures[0].texture.texnum = 0;
    }
    return (int)psVar7;
  }
  local_50 = (ulong)(param & 3);
  uVar21 = 0x420d;
  if ((param & 4U) == 0) {
    uVar21 = 0xd;
  }
  uVar19 = (param2 & 0x400U) << 0x15 | (param2 & 0x200U) << 0x12;
  local_38 = &psVar4->ceilingplane;
  local_40 = &psVar4->planes[1].Texture;
  local_48 = &psVar4->floorplane;
  pFVar1 = &psVar4->planes[0].Texture;
LAB_004fe413:
  psVar24 = sectors + uVar9;
  uVar9 = 0xff;
  uVar18 = (param2 & 1U) << 0x19 | 0x202029;
  if (param != 4) {
    if (param == 0) {
      uVar18 = 0x40000f;
      if (0 < (long)psVar4->linecount) {
        lVar20 = 0;
        do {
          plVar5 = psVar4->lines[lVar20];
          if ((plVar5->special == 0xa1) && (plVar5->frontsector == psVar4)) {
            iVar3 = plVar5->args[1];
            uVar9 = plVar5->args[2];
            iVar23 = iVar3;
            if (99 < iVar3) {
              iVar23 = 100;
            }
            if (iVar23 < 1) {
              iVar23 = 0;
            }
            uVar18 = (uint)(iVar3 < 100) * 0x800 +
                     ((uVar9 & 6) << 0x18 | (uVar9 & 8) << 0x19) + (uint)((uVar9 & 1) == 0) * 2 +
                     0x40000d;
            if ((long)plVar5->args[0] != 0) {
              uVar18 = uVar18 | 0x20004210;
              pFVar10 = plVar5->frontsector->ColorMap;
              pFVar10 = GetSpecialLights((PalEntry)(pFVar10->Color).field_0.field_0,
                                         (PalEntry)
                                         ((anon_union_4_2_12391d7c_for_PalEntry_0 *)
                                         (P_Set3DFloor::vavoomcolors + plVar5->args[0]))->field_0,
                                         pFVar10->Desaturate);
              plVar5->frontsector->ColorMap = pFVar10;
            }
            uVar9 = (iVar23 * 0xff & 0xffffU) / 100;
            goto LAB_004fe5d1;
          }
          lVar20 = lVar20 + 1;
        } while (psVar4->linecount != lVar20);
        uVar9 = 0xff;
      }
    }
    else {
      uVar18 = (P_Set3DFloor::defflags[local_50] | uVar21) ^ (param & 0x30U) << 0x15 |
               (param2 & 0x30U) << 0xd |
               (param2 & 8U) << 0x10 |
               (param2 & 4U) << 10 | (param2 & 2U) << 0xf | (param2 & 1U) << 5;
      uVar9 = uVar18 | 0x10000800;
      if ((param2 & 0x40U) == 0) {
        uVar9 = uVar18;
      }
      uVar17 = uVar9 | 0x26000000;
      if ((uVar9 & 2) != 0) {
        uVar17 = uVar9;
      }
      if (-1 < (char)param2) {
        uVar17 = uVar9;
      }
      uVar18 = uVar17 | uVar19;
      iVar3 = line->sidedef[0]->textures[0].texture.texnum;
      uVar9 = -iVar3;
      if (-1 < iVar3) {
        uVar9 = alpha;
      }
      if (0xfe < alpha) {
        uVar9 = alpha;
      }
      if (0xfe < (int)uVar9) {
        uVar9 = 0xff;
      }
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      if (uVar9 != 0xff) {
        if (uVar9 == 0) {
          uVar18 = uVar17 & 0xffffbdf3 | uVar19;
          uVar9 = 0;
        }
        else {
          uVar18 = uVar18 | 0x800;
        }
      }
    }
  }
LAB_004fe5d1:
  alpha = uVar9;
  do {
    if ((uVar18 >> 0x1e & 1) == 0) {
      peVar6 = psVar4->e;
      this = &(peVar6->XFloor).attached;
      uVar11 = (ulong)(peVar6->XFloor).attached.Count;
      if (uVar11 != 0) {
        uVar15 = 0;
        do {
          if (this->Array[uVar15] == psVar24) goto LAB_004fe872;
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
      }
      TArray<sector_t_*,_sector_t_*>::Grow(this,1);
      uVar9 = (peVar6->XFloor).attached.Count;
      (peVar6->XFloor).attached.Array[uVar9] = psVar24;
      (peVar6->XFloor).attached.Count = uVar9 + 1;
    }
    pFVar12 = (F3DFloor *)operator_new(0x98);
    (pFVar12->bottom).copied = false;
    (pFVar12->top).copied = false;
    pFVar12->model = psVar4;
    (pFVar12->bottom).model = psVar4;
    (pFVar12->top).model = psVar4;
    pFVar12->target = psVar24;
    pFVar12->floorclip = (short *)0x0;
    pFVar12->ceilingclip = (short *)0x0;
    pFVar12->validcount = 0;
    pFVar16 = local_40;
    psVar14 = local_38;
    if ((uVar18 & 0x80000) == 0) {
      pFVar16 = pFVar1;
      psVar14 = local_48;
    }
    (pFVar12->bottom).plane = psVar14;
    (pFVar12->bottom).texture = pFVar16;
    (pFVar12->bottom).isceiling = (uVar18 & 0x80000) >> 0x13;
    bVar25 = (uVar18 >> 0x15 & 1) == 0;
    psVar14 = local_38;
    pFVar16 = local_40;
    psVar22 = psVar4;
    if (!bVar25) {
      (pFVar12->top).model = psVar24;
      psVar14 = &psVar24->floorplane;
      pFVar16 = pFVar1;
      psVar22 = psVar24;
    }
    ppVar13 = &pFVar12->top;
    (pFVar12->top).plane = psVar14;
    (pFVar12->top).texture = pFVar16;
    pFVar12->toplightlevel = &psVar22->lightlevel;
    (pFVar12->top).isceiling = (uint)bVar25;
    if ((uVar18 >> 0x16 & 1) != 0) {
      local_58 = *(undefined8 *)&(pFVar12->top).copied;
      local_78 = ppVar13->plane;
      pFStack_70 = (pFVar12->top).texture;
      local_68 = (pFVar12->top).model;
      uStack_60._0_4_ = (pFVar12->top).isceiling;
      uStack_60._4_4_ = (pFVar12->top).vindex;
      uVar8 = *(undefined7 *)&(pFVar12->bottom).field_0x21;
      (pFVar12->top).copied = (pFVar12->bottom).copied;
      *(undefined7 *)&(pFVar12->top).field_0x21 = uVar8;
      psVar14 = (pFVar12->bottom).plane;
      pFVar16 = (pFVar12->bottom).texture;
      iVar3 = (pFVar12->bottom).isceiling;
      iVar23 = (pFVar12->bottom).vindex;
      (pFVar12->top).model = (pFVar12->bottom).model;
      (pFVar12->top).isceiling = iVar3;
      (pFVar12->top).vindex = iVar23;
      ppVar13->plane = psVar14;
      (pFVar12->top).texture = pFVar16;
      *(undefined8 *)&(pFVar12->bottom).copied = local_58;
      (pFVar12->bottom).model = local_68;
      (pFVar12->bottom).isceiling = (undefined4)uStack_60;
      (pFVar12->bottom).vindex = uStack_60._4_4_;
      (pFVar12->bottom).plane = local_78;
      (pFVar12->bottom).texture = pFStack_70;
      if ((uVar18 & 0x10) != 0) {
        (pFVar12->bottom).plane = &psVar24->floorplane;
        (pFVar12->bottom).model = psVar24;
        (pFVar12->bottom).isceiling = 0;
      }
      psVar14 = ppVar13->plane;
    }
    pFVar12->flags = uVar18;
    pFVar12->master = line;
    pFVar12->alpha = alpha;
    (pFVar12->bottom).vindex = -1;
    (pFVar12->top).vindex = -1;
    dVar2 = (psVar14->normal).X;
    if ((((dVar2 != 0.0) || (NAN(dVar2))) || (dVar2 = (psVar14->normal).Y, dVar2 != 0.0)) ||
       (NAN(dVar2))) {
LAB_004fe7bc:
      pFVar12->alpha = 0x10000;
      pFVar12->flags = uVar18 & 0xefffffff;
    }
    else {
      psVar14 = (pFVar12->bottom).plane;
      dVar2 = (psVar14->normal).X;
      if (((dVar2 != 0.0) || (NAN(dVar2))) ||
         ((dVar2 = (psVar14->normal).Y, dVar2 != 0.0 || (NAN(dVar2))))) goto LAB_004fe7bc;
    }
    if ((uVar18 >> 0x1e & 1) != 0) {
      local_58 = *(undefined8 *)&(pFVar12->top).copied;
      local_78 = ppVar13->plane;
      pFStack_70 = (pFVar12->top).texture;
      local_68 = (pFVar12->top).model;
      uStack_60._0_4_ = (pFVar12->top).isceiling;
      uStack_60._4_4_ = (pFVar12->top).vindex;
      uVar8 = *(undefined7 *)&(pFVar12->bottom).field_0x21;
      (pFVar12->top).copied = (pFVar12->bottom).copied;
      *(undefined7 *)&(pFVar12->top).field_0x21 = uVar8;
      psVar14 = (pFVar12->bottom).plane;
      pFVar16 = (pFVar12->bottom).texture;
      iVar3 = (pFVar12->bottom).isceiling;
      iVar23 = (pFVar12->bottom).vindex;
      (pFVar12->top).model = (pFVar12->bottom).model;
      (pFVar12->top).isceiling = iVar3;
      (pFVar12->top).vindex = iVar23;
      ppVar13->plane = psVar14;
      (pFVar12->top).texture = pFVar16;
      *(undefined8 *)&(pFVar12->bottom).copied = local_58;
      (pFVar12->bottom).model = local_68;
      (pFVar12->bottom).isceiling = (undefined4)uStack_60;
      (pFVar12->bottom).vindex = uStack_60._4_4_;
      (pFVar12->bottom).plane = local_78;
      (pFVar12->bottom).texture = pFStack_70;
    }
    peVar6 = psVar24->e;
    TArray<F3DFloor_*,_F3DFloor_*>::Grow((TArray<F3DFloor_*,_F3DFloor_*> *)&peVar6->XFloor,1);
    uVar9 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar9] = pFVar12;
    (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count = uVar9 + 1;
    if (((uVar18 >> 9 & 1) == 0) || (vid_renderer.Value != 0)) break;
    uVar18 = uVar18 & 0x10400800 | 0x46000029;
  } while( true );
LAB_004fe872:
  uVar9 = FSectorTagIterator::Next(&local_80);
  if ((int)uVar9 < 0) goto LAB_004fe884;
  goto LAB_004fe413;
}

Assistant:

static int P_Set3DFloor(line_t * line, int param, int param2, int alpha)
{
	int s, i;
	int flags;
	int tag = line->args[0];
	sector_t * sec = line->frontsector, *ss;

	FSectorTagIterator itr(tag);
	while ((s = itr.Next()) >= 0)
	{
		ss = &sectors[s];

		if (param == 0)
		{
			flags = FF_EXISTS | FF_RENDERALL | FF_SOLID | FF_INVERTSECTOR;
			alpha = 255;
			for (i = 0; i < sec->linecount; i++)
			{
				line_t * l = sec->lines[i];

				if (l->special == Sector_SetContents && l->frontsector == sec)
				{
					alpha = clamp<int>(l->args[1], 0, 100);
					if (l->args[2] & 1) flags &= ~FF_SOLID;
					if (l->args[2] & 2) flags |= FF_SEETHROUGH;
					if (l->args[2] & 4) flags |= FF_SHOOTTHROUGH;
					if (l->args[2] & 8) flags |= FF_ADDITIVETRANS;
					if (alpha != 100) flags |= FF_TRANSLUCENT;//|FF_BOTHPLANES|FF_ALLSIDES;
					if (l->args[0])
					{
						// Yes, Vavoom's 3D-floor definitions suck!
						// The content list changed in r1783 of Vavoom to be unified
						// among all its supported games, so it has now ten different
						// values instead of just five.
						static DWORD vavoomcolors[] = { VC_EMPTY,
							VC_WATER, VC_LAVA, VC_NUKAGE, VC_SLIME, VC_HELLSLIME,
							VC_BLOOD, VC_SLUDGE, VC_HAZARD, VC_BOOMWATER };
						flags |= FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_FLOOD;

						l->frontsector->ColorMap =
							GetSpecialLights(l->frontsector->ColorMap->Color,
							vavoomcolors[l->args[0]],
							l->frontsector->ColorMap->Desaturate);
					}
					alpha = (alpha * 255) / 100;
					break;
				}
			}
		}
		else if (param == 4)
		{
			flags = FF_EXISTS | FF_RENDERPLANES | FF_INVERTPLANES | FF_NOSHADE | FF_FIX;
			if (param2 & 1) flags |= FF_SEETHROUGH;	// marker for allowing missing texture checks
			alpha = 255;
		}
		else
		{
			static const int defflags[] = { 0,
				FF_SOLID,
				FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_SHOOTTHROUGH | FF_SEETHROUGH,
				FF_SHOOTTHROUGH | FF_SEETHROUGH,
			};

			flags = defflags[param & 3] | FF_EXISTS | FF_RENDERALL;

			if (param & 4) flags |= FF_ALLSIDES | FF_BOTHPLANES;
			if (param & 16) flags ^= FF_SEETHROUGH;
			if (param & 32) flags ^= FF_SHOOTTHROUGH;

			if (param2 & 1) flags |= FF_NOSHADE;
			if (param2 & 2) flags |= FF_DOUBLESHADOW;
			if (param2 & 4) flags |= FF_FOG;
			if (param2 & 8) flags |= FF_THINFLOOR;
			if (param2 & 16) flags |= FF_UPPERTEXTURE;
			if (param2 & 32) flags |= FF_LOWERTEXTURE;
			if (param2 & 64) flags |= FF_ADDITIVETRANS | FF_TRANSLUCENT;
			// if flooding is used the floor must be non-solid and is automatically made shootthrough and seethrough
			if ((param2 & 128) && !(flags & FF_SOLID)) flags |= FF_FLOOD | FF_SEETHROUGH | FF_SHOOTTHROUGH;
			if (param2 & 512) flags |= FF_FADEWALLS;
			if (param2&1024) flags |= FF_RESET;
			FTextureID tex = line->sidedef[0]->GetTexture(side_t::top);
			if (!tex.Exists() && alpha < 255)
			{
				alpha = -tex.GetIndex();
			}
			alpha = clamp(alpha, 0, 255);
			if (alpha == 0) flags &= ~(FF_RENDERALL | FF_BOTHPLANES | FF_ALLSIDES);
			else if (alpha != 255) flags |= FF_TRANSLUCENT;

		}
		P_Add3DFloor(ss, sec, line, flags, alpha);
	}
	// To be 100% safe this should be done even if the alpha by texture value isn't used.
	if (!line->sidedef[0]->GetTexture(side_t::top).isValid())
		line->sidedef[0]->SetTexture(side_t::top, FNullTextureID());
	return 1;
}